

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedReadWriteCase1CS::Run(AdvancedReadWriteCase1CS *this)

{
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  int local_884;
  int local_880;
  int i_3;
  int i_2;
  int i_1;
  GLint *out_data;
  uint local_868;
  int i;
  GLint data [512];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  AdvancedReadWriteCase1CS *pAStack_18;
  bool status;
  AdvancedReadWriteCase1CS *this_local;
  
  glsl_cs._7_1_ = 1;
  local_28 = 
  "\nlayout(local_size_x = 128) in;\nstruct s {\n  int ene;\n  int due;\n  int like;\n  int fake;\n};\nlayout(std430) coherent buffer Buffer {\n  s a[128];\n} g_buffer;\nvoid main() {\n  g_buffer.a[gl_LocalInvocationIndex].due = g_buffer.a[gl_LocalInvocationIndex].ene;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].like = g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].due;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].fake = g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].like;\n}"
  ;
  pAStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nlayout(local_size_x = 128) in;\nstruct s {\n  int ene;\n  int due;\n  int like;\n  int fake;\n};\nlayout(std430) coherent buffer Buffer {\n  s a[128];\n} g_buffer;\nvoid main() {\n  g_buffer.a[gl_LocalInvocationIndex].due = g_buffer.a[gl_LocalInvocationIndex].ene;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].like = g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].due;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].fake = g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].like;\n}"
             ,&local_49);
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_48);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    for (out_data._4_4_ = 0; out_data._4_4_ < 0x80; out_data._4_4_ = out_data._4_4_ + 1) {
      (&local_868)[out_data._4_4_ << 2] = out_data._4_4_ + 0x100;
      (&local_868)[out_data._4_4_ * 4 + 1] = 0;
      (&local_868)[out_data._4_4_ * 4 + 2] = 0;
      (&local_868)[out_data._4_4_ * 4 + 3] = 0;
    }
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x800,&local_868,0x88e8);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x800,1);
    if (pvVar3 == (void *)0x0) {
      this_local = (AdvancedReadWriteCase1CS *)&DAT_ffffffffffffffff;
    }
    else {
      for (i_3 = 0; i_3 < 0x80; i_3 = i_3 + 1) {
        if (*(uint *)((long)pvVar3 + (long)(i_3 * 4 + 3) * 4) != (&local_868)[i_3 << 2]) {
          anon_unknown_0::Output
                    ("Received: %d, but expected: %d -> %d -> %d\n",
                     (ulong)*(uint *)((long)pvVar3 + (long)(i_3 * 4 + 3) * 4),
                     (ulong)(&local_868)[i_3 << 2],
                     (ulong)*(uint *)((long)pvVar3 + (long)(i_3 * 4 + 1) * 4),
                     (ulong)*(uint *)((long)pvVar3 + (long)(i_3 * 4 + 2) * 4));
          glsl_cs._7_1_ = 0;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      for (local_880 = 0; local_880 < 0x80; local_880 = local_880 + 1) {
        (&local_868)[local_880 << 2] = local_880 + 0x200;
        (&local_868)[local_880 * 4 + 1] = 0;
        (&local_868)[local_880 * 4 + 2] = 0;
        (&local_868)[local_880 * 4 + 3] = 0;
      }
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x800,&local_868,0x88e8);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      pvVar3 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x800,1);
      if (pvVar3 == (void *)0x0) {
        this_local = (AdvancedReadWriteCase1CS *)&DAT_ffffffffffffffff;
      }
      else {
        for (local_884 = 0; local_884 < 0x80; local_884 = local_884 + 1) {
          if (*(uint *)((long)pvVar3 + (long)(local_884 * 4 + 3) * 4) !=
              (&local_868)[local_884 << 2]) {
            anon_unknown_0::Output
                      ("Received: %d, but expected: %d\n",
                       (ulong)*(uint *)((long)pvVar3 + (long)(local_884 * 4 + 3) * 4),
                       (ulong)(&local_868)[local_884 << 2]);
            glsl_cs._7_1_ = 0;
          }
        }
        if ((glsl_cs._7_1_ & 1) == 0) {
          this_local = (AdvancedReadWriteCase1CS *)&DAT_ffffffffffffffff;
        }
        else {
          this_local = (AdvancedReadWriteCase1CS *)0x0;
        }
      }
    }
  }
  else {
    this_local = (AdvancedReadWriteCase1CS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool status = true;

		const char* const glsl_cs = NL
			"layout(local_size_x = 128) in;" NL "struct s {" NL "  int ene;" NL "  int due;" NL "  int like;" NL
			"  int fake;" NL "};" NL "layout(std430) coherent buffer Buffer {" NL "  s a[128];" NL "} g_buffer;" NL
			"void main() {" NL "  g_buffer.a[gl_LocalInvocationIndex].due = g_buffer.a[gl_LocalInvocationIndex].ene;" NL
			"  groupMemoryBarrier();" NL "  barrier();" NL "  g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].like = "
			"g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].due;" NL "  groupMemoryBarrier();" NL "  barrier();" NL
			"  g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].fake "
			"= g_buffer.a[(gl_LocalInvocationIndex + 17u) % "
			"128u].like;" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		GLint data[128 * 4];
		for (int i = 0; i < 128; ++i)
		{
			data[i * 4]		= i + 256;
			data[i * 4 + 1] = 0;
			data[i * 4 + 2] = 0;
			data[i * 4 + 3] = 0;
		}
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLint* out_data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		for (int i = 0; i < 128; ++i)
		{
			if (out_data[i * 4 + 3] != data[i * 4])
			{
				Output("Received: %d, but expected: %d -> %d -> %d\n", out_data[i * 4 + 3], data[i * 4],
					   out_data[i * 4 + 1], out_data[i * 4 + 2]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		for (int i = 0; i < 128; ++i)
		{
			data[i * 4]		= i + 512;
			data[i * 4 + 1] = 0;
			data[i * 4 + 2] = 0;
			data[i * 4 + 3] = 0;
		}
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		out_data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		for (int i = 0; i < 128; ++i)
		{
			if (out_data[i * 4 + 3] != data[i * 4])
			{
				Output("Received: %d, but expected: %d\n", out_data[i * 4 + 3], data[i * 4]);
				status = false;
			}
		}
		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}